

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_partial_sig_serialize
              (secp256k1_context *ctx,uchar *out32,secp256k1_musig_partial_sig *sig)

{
  int iVar1;
  secp256k1_callback *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/session_impl.h"
            ,0x127,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (undefined8 *)0x0) {
    secp256k1_callback_call(in_RDX,in_stack_ffffffffffffffd8);
    local_4 = 0;
  }
  else if (in_RDX == (secp256k1_callback *)0x0) {
    secp256k1_callback_call((secp256k1_callback *)0x0,in_stack_ffffffffffffffd8);
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_memcmp_var(in_RDX,secp256k1_musig_partial_sig_magic,4);
    if (iVar1 == 0) {
      *in_RSI = *(undefined8 *)((long)&in_RDX->fn + 4);
      in_RSI[1] = *(undefined8 *)((long)&in_RDX->data + 4);
      in_RSI[2] = *(undefined8 *)((long)&in_RDX[1].fn + 4);
      in_RSI[3] = *(undefined8 *)((long)&in_RDX[1].data + 4);
      local_4 = 1;
    }
    else {
      secp256k1_callback_call(in_RDX,in_stack_ffffffffffffffd8);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_partial_sig_serialize(const secp256k1_context* ctx, unsigned char *out32, const secp256k1_musig_partial_sig* sig) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(out32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(secp256k1_memcmp_var(&sig->data[0], secp256k1_musig_partial_sig_magic, 4) == 0);

    memcpy(out32, &sig->data[4], 32);
    return 1;
}